

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_writer.h
# Opt level: O2

string * cppwinrt::file_to_string(string *__return_storage_ptr__,string *filename)

{
  stringstream asStack_398 [16];
  ostream local_388 [376];
  ifstream file;
  streambuf local_200 [504];
  
  std::ifstream::ifstream(&file,(string *)filename,_S_bin);
  std::__cxx11::stringstream::stringstream(asStack_398);
  std::ostream::operator<<(local_388,local_200);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(asStack_398);
  std::ifstream::~ifstream(&file);
  return __return_storage_ptr__;
}

Assistant:

inline std::string file_to_string(std::string const& filename)
    {
        std::ifstream file(filename, std::ios::binary);
        return static_cast<std::stringstream const&>(std::stringstream() << file.rdbuf()).str();
    }